

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,DockPosition dockPos)

{
  QRect QVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QSize gapSize;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QRect *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char local_98 [32];
  char local_78 [40];
  QSize local_50;
  QSize local_48;
  QSize local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  local_48 = operator/((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (qreal)in_stack_ffffffffffffff08);
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  local_40 = QSize::boundedTo((QSize *)in_stack_ffffffffffffff08,
                              (QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                             );
  iVar3 = QWidget::height((QWidget *)0x5778ce);
  if (SBORROW4(iVar3,*(int *)(in_RDI + 0x200) * 2) != iVar3 + *(int *)(in_RDI + 0x200) * -2 < 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaDockWidgets();
    anon_unknown.dwarf_8bde89::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_8bde89::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x577936);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (char *)0x57794f);
      uVar4 = QWidget::height((QWidget *)0x57795d);
      QMessageLogger::warning
                (local_78,
                 "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible."
                 ,(ulong)uVar4);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
  }
  iVar3 = QWidget::width((QWidget *)0x57798f);
  if (SBORROW4(iVar3,*(int *)(in_RDI + 0x200) * 2) != iVar3 + *(int *)(in_RDI + 0x200) * -2 < 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaDockWidgets();
    anon_unknown.dwarf_8bde89::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_8bde89::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x5779f7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (char *)0x577a0d);
      uVar4 = QWidget::width((QWidget *)0x577a1b);
      QMessageLogger::warning
                (local_98,
                 "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible."
                 ,(ulong)uVar4);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
  }
  switch(in_ESI) {
  case 0:
    QRect::left((QRect *)0x577a73);
    QRect::top((QRect *)0x577a85);
    QSize::width((QSize *)0x577a96);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QRect::QRect(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    break;
  case 1:
    QRect::right((QRect *)0x577ad7);
    QSize::width((QSize *)0x577ae8);
    QRect::top((QRect *)0x577b02);
    QSize::width((QSize *)0x577b13);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QRect::QRect(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    break;
  case 2:
    QRect::left((QRect *)0x577b54);
    QRect::top((QRect *)0x577b66);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QSize::height((QSize *)0x577b89);
    QRect::QRect(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    break;
  case 3:
    QRect::left((QRect *)0x577bb8);
    QRect::bottom((QRect *)0x577bca);
    QSize::height((QSize *)0x577bdb);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QSize::height((QSize *)0x577c06);
    QRect::QRect(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    break;
  case 4:
  default:
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.x2.m_i = (undefined4)local_30;
  QVar1.y2.m_i = local_30._4_4_;
  QVar1.x1.m_i = (undefined4)local_38;
  QVar1.y1.m_i = local_38._4_4_;
  return QVar1;
}

Assistant:

QRect QDockAreaLayout::gapRect(QInternal::DockPosition dockPos) const
{
    Q_ASSERT_X(mainWindow, "QDockAreaLayout::gapRect", "Called without valid mainWindow pointer.");

    // Determine gap size depending on MainWindow size (QTBUG-101657)
    const QSize gapSize = (mainWindow->size()/2).boundedTo(QSize(EmptyDropAreaSize, EmptyDropAreaSize));

    // Warn if main window is too small to create proper docks.
    // Do not fail because this can be triggered by a user making MainWindow too small
    if (mainWindow->height() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible.",
            mainWindow->height());

    }
    if (mainWindow->width() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible.",
            mainWindow->width());
    }

    // Calculate rectangle of requested dock
    switch (dockPos) {
    case QInternal::LeftDock:
        return QRect(rect.left(), rect.top(), gapSize.width(), rect.height());
    case QInternal::RightDock:
        return QRect(rect.right() - gapSize.width(), rect.top(), gapSize.width(), rect.height());
    case QInternal::TopDock:
        return QRect(rect.left(), rect.top(), rect.width(), gapSize.height());
    case QInternal::BottomDock:
        return QRect(rect.left(), rect.bottom() - gapSize.height(), rect.width(), gapSize.height());
    case QInternal::DockCount:
        break;
    }
    return QRect();
}